

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNG_Image.cxx
# Opt level: O0

void png_read_data_from_mem(png_structp png_ptr,png_bytep data,png_size_t length)

{
  undefined8 *puVar1;
  fl_png_memory *png_mem_data;
  png_size_t length_local;
  png_bytep data_local;
  png_structp png_ptr_local;
  
  puVar1 = (undefined8 *)png_get_io_ptr(png_ptr);
  if ((ulong)puVar1[2] < puVar1[1] + length) {
    png_error(*puVar1,"Invalid attempt to read row data");
  }
  memcpy(data,(void *)puVar1[1],length);
  puVar1[1] = length + puVar1[1];
  return;
}

Assistant:

static void png_read_data_from_mem( png_structp png_ptr, //pointer to our data
				      png_bytep data,  // where to copy the image data for libpng computing
				      png_size_t length) // length of data to copy
  {
    fl_png_memory *png_mem_data = (fl_png_memory*)png_get_io_ptr(png_ptr); // get the pointer to our struct
    if (png_mem_data->current + length > png_mem_data->last) {
      png_error(png_mem_data->pp, "Invalid attempt to read row data");
      return;
    }
    /* copy data from image buffer */
    memcpy (data, png_mem_data->current, length);
    /* advance in the memory data */
    png_mem_data->current += length;
  }